

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3SafetyCheckOk(sqlite3 *db)

{
  int iVar1;
  long in_RDI;
  u32 magic;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    logBadConnection((char *)0x139fed);
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0x70) == -0x5fd65969) {
    local_4 = 1;
  }
  else {
    iVar1 = sqlite3SafetyCheckSickOrOk
                      ((sqlite3 *)CONCAT44(*(int *)(in_RDI + 0x70),in_stack_ffffffffffffffe8));
    if (iVar1 != 0) {
      logBadConnection((char *)0x13a028);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3SafetyCheckOk(sqlite3 *db){
  u32 magic;
  if( db==0 ){
    logBadConnection("NULL");
    return 0;
  }
  magic = db->magic;
  if( magic!=SQLITE_MAGIC_OPEN ){
    if( sqlite3SafetyCheckSickOrOk(db) ){
      testcase( sqlite3GlobalConfig.xLog!=0 );
      logBadConnection("unopened");
    }
    return 0;
  }else{
    return 1;
  }
}